

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_bnd.c
# Opt level: O3

void PrintOutput(N_Vector u)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  double dVar7;
  
  puVar1 = (undefined8 *)N_VGetArrayPointer();
  printf("            ");
  dVar7 = 1.0;
  uVar2 = 0xfffffffe;
  do {
    printf("%-8.5f ",dVar7 * 0.03125);
    dVar7 = dVar7 + 3.0;
    uVar2 = uVar2 + 3;
  } while (uVar2 < 0x1d);
  puts("\n");
  uVar4 = 1;
  do {
    printf("%-8.5f    ",(double)(int)uVar4 * 0.03125);
    uVar5 = 0xfffffffffffffffe;
    puVar3 = puVar1;
    do {
      printf("%-8.5f ",*puVar3);
      puVar3 = puVar3 + 0x5d;
      uVar5 = uVar5 + 3;
    } while (uVar5 < 0x1d);
    putchar(10);
    puVar1 = puVar1 + 3;
    bVar6 = uVar4 < 0x1d;
    uVar4 = uVar4 + 3;
  } while (bVar6);
  return;
}

Assistant:

static void PrintOutput(N_Vector u)
{
  int i, j;
  sunrealtype dx, dy, x, y;
  sunrealtype* udata;

  dx = ONE / (NX + 1);
  dy = ONE / (NY + 1);

  udata = N_VGetArrayPointer(u);

  printf("            ");
  for (i = 1; i <= NX; i += SKIP)
  {
    x = i * dx;
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("%-8.5Lf ", x);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf("%-8.5f ", x);
#else
    printf("%-8.5f ", x);
#endif
  }
  printf("\n\n");

  for (j = 1; j <= NY; j += SKIP)
  {
    y = j * dy;
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("%-8.5Lf    ", y);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf("%-8.5f    ", y);
#else
    printf("%-8.5f    ", y);
#endif
    for (i = 1; i <= NX; i += SKIP)
    {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      printf("%-8.5Lf ", IJth(udata, i, j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      printf("%-8.5f ", IJth(udata, i, j));
#else
      printf("%-8.5f ", IJth(udata, i, j));
#endif
    }
    printf("\n");
  }
}